

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadAssetInfo(ColladaParser *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__s1;
  undefined4 extraout_var_02;
  ai_real extraout_XMM0_Da;
  string local_50;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
LAB_00430303:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"unit");
        if (iVar1 == 0) {
          uVar3 = TestAttribute(this,"meter");
          if (uVar3 == 0xffffffff) {
            this->mUnitSize = 1.0;
          }
          else {
            (*this->mReader->_vptr_IIrrXMLReader[0xc])(this->mReader,(ulong)uVar3);
            this->mUnitSize = extraout_XMM0_Da;
          }
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar1 == '\0') {
            SkipElement(this);
          }
        }
        else {
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar1 != 1) goto LAB_00430303;
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"up_axis");
          if (iVar1 == 0) {
            __s1 = GetTextContent(this);
            iVar1 = strncmp(__s1,"X_UP",4);
            if (iVar1 == 0) {
              this->mUpDirection = UP_X;
            }
            else {
              iVar1 = strncmp(__s1,"Z_UP",4);
              if (iVar1 == 0) {
                this->mUpDirection = UP_Z;
              }
              else {
                this->mUpDirection = UP_Y;
              }
            }
            TestClosing(this,"up_axis");
          }
          else {
            iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar1 != 1) goto LAB_00430303;
            iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar1 = strcmp((char *)CONCAT44(extraout_var_01,iVar1),"contributor");
            if (iVar1 == 0) {
              ReadContributorInfo(this);
            }
            else {
              ReadMetaDataItem(this,&this->mAssetMetaData);
            }
          }
        }
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_02,iVar1),"asset");
        if (iVar1 == 0) {
          return;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Expected end of <asset> element.","");
        ThrowException(this,&local_50);
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadAssetInfo()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("unit"))
            {
                // read unit data from the element's attributes
                const int attrIndex = TestAttribute("meter");
                if (attrIndex == -1) {
                    mUnitSize = 1.f;
                }
                else {
                    mUnitSize = mReader->getAttributeValueAsFloat(attrIndex);
                }

                // consume the trailing stuff
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("up_axis"))
            {
                // read content, strip whitespace, compare
                const char* content = GetTextContent();
                if (strncmp(content, "X_UP", 4) == 0)
                    mUpDirection = UP_X;
                else if (strncmp(content, "Z_UP", 4) == 0)
                    mUpDirection = UP_Z;
                else
                    mUpDirection = UP_Y;

                // check element end
                TestClosing("up_axis");
            }
            else if (IsElement("contributor"))
            {
                ReadContributorInfo();
            }
            else
            {
                ReadMetaDataItem(mAssetMetaData);
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "asset") != 0)
                ThrowException("Expected end of <asset> element.");

            break;
        }
    }
}